

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O0

void __thiscall QHttpNetworkRequest::clearHeaders(QHttpNetworkRequest *this)

{
  QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->
            ((QSharedDataPointer<QHttpNetworkRequestPrivate> *)this);
  QHttpNetworkHeaderPrivate::clearHeaders((QHttpNetworkHeaderPrivate *)0x30a2fe);
  return;
}

Assistant:

void QHttpNetworkRequest::clearHeaders()
{
    d->clearHeaders();
}